

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_btGetAllMatches_noDict_6
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  uint uVar1;
  U32 *pUVar2;
  uint uVar3;
  U32 UVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  U32 UVar15;
  BYTE *pBVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint local_dc;
  uint *local_d8;
  uint *local_d0;
  ulong local_c0;
  uint local_b4;
  uint local_6c;
  ZSTD_match_t *local_68;
  size_t local_60;
  U32 *local_58;
  BYTE *local_50;
  ulong local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_68 = matches;
  if ((ms->cParams).minMatch < 6) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar16 = (ms->window).base;
  uVar20 = (ulong)ms->nextToUpdate;
  if (ip < pBVar16 + uVar20) {
    return 0;
  }
  while( true ) {
    uVar19 = (uint)uVar20;
    uVar10 = (uint)((long)ip - (long)pBVar16);
    if (uVar10 <= uVar19) break;
    UVar4 = ZSTD_insertBt1(ms,pBVar16 + uVar20,iHighLimit,uVar10,6,0);
    uVar20 = (ulong)(UVar4 + uVar19);
    if (UVar4 + uVar19 <= uVar19) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar16) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar16) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar10;
  uVar10 = (ms->cParams).targetLength;
  uVar19 = 0xfff;
  if (uVar10 < 0xfff) {
    uVar19 = uVar10;
  }
  uVar10 = (ms->cParams).hashLog;
  if (0x20 < uVar10) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_38 = (ms->window).base;
  uVar18 = (int)ip - (int)local_38;
  pUVar2 = ms->hashTable;
  local_60 = ZSTD_hash6Ptr(ip,uVar10);
  uVar14 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  UVar4 = 0;
  uVar10 = uVar18 - uVar14;
  if (uVar18 < uVar14) {
    uVar10 = 0;
  }
  UVar15 = 1;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar1 = (ms->window).lowLimit;
  uVar3 = uVar18 - uVar13;
  if (uVar18 - uVar1 <= uVar13) {
    uVar3 = uVar1;
  }
  if (ms->loadedDictEnd != 0) {
    uVar3 = uVar1;
  }
  uVar1 = (ms->cParams).searchLog;
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x819e,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  uVar20 = (ulong)pUVar2[local_60];
  local_40 = ms->chainTable;
  uVar13 = (ms->window).dictLimit;
  uVar17 = (ulong)((uVar14 & uVar18) * 2);
  local_d0 = local_40 + uVar17;
  local_d8 = local_40 + uVar17 + 1;
  local_dc = uVar18 + 9;
  local_c0 = (ulong)(lengthToBeat - 1);
  local_50 = ip + 4;
  local_58 = pUVar2;
  local_48 = uVar20;
  for (uVar17 = (ulong)ll0; ll0 + 3 != uVar17; uVar17 = uVar17 + 1) {
    if (uVar17 == 3) {
      uVar11 = *rep - 1;
    }
    else {
      uVar11 = rep[uVar17];
    }
    if (uVar18 < uVar13) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81a5,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar11 - 1 < uVar18 - uVar13) {
      uVar5 = 0;
      if ((uVar3 <= uVar18 - uVar11) && (uVar5 = 0, *(int *)ip == *(int *)(ip + -(ulong)uVar11))) {
        sVar7 = ZSTD_count(local_50,local_50 + -(ulong)uVar11,iHighLimit);
        uVar5 = (int)sVar7 + 4;
        uVar20 = local_48;
      }
    }
    else {
      uVar5 = 0;
      if (uVar18 < uVar3) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81b1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
    }
    uVar12 = (ulong)uVar5;
    if (local_c0 < uVar12) {
      local_68[UVar4].off = UVar15;
      local_68[UVar4].len = uVar5;
      UVar4 = UVar4 + 1;
      if (uVar19 < uVar5) {
        return UVar4;
      }
      local_c0 = uVar12;
      if (ip + uVar12 == iHighLimit) {
        return UVar4;
      }
    }
    UVar15 = UVar15 + 1;
  }
  local_58[local_60] = uVar18;
  uVar17 = 0;
  uVar12 = 0;
  local_b4 = 1 << ((byte)uVar1 & 0x1f);
  do {
    if ((local_b4 == 0) || (uVar19 = (uint)uVar20, uVar19 < uVar3 + (uVar3 == 0)))
    goto LAB_001a1d7f;
    uVar8 = uVar17;
    if (uVar12 < uVar17) {
      uVar8 = uVar12;
    }
    if (uVar18 <= uVar19) {
      __assert_fail("curr > matchIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81f1,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if ((uVar20 & 0xffffffff) + uVar8 < (ulong)uVar13) {
      __assert_fail("matchIndex+matchLength >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81f4,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    pBVar16 = local_38 + (uVar20 & 0xffffffff);
    if ((uVar13 <= uVar19) && (iVar6 = bcmp(pBVar16,ip,uVar8), iVar6 != 0)) {
      __assert_fail("memcmp(match, ip, matchLength) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81f6,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    sVar7 = ZSTD_count(ip + uVar8,pBVar16 + uVar8,iHighLimit);
    uVar8 = sVar7 + uVar8;
    if (local_c0 < uVar8) {
      if (local_dc < uVar19 || local_dc - uVar19 == 0) {
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8203,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_dc - uVar19 < uVar8) {
        local_dc = uVar19 + (U32)uVar8;
      }
      local_68[UVar4].off = (uVar18 + 3) - uVar19;
      local_68[UVar4].len = (U32)uVar8;
      UVar4 = UVar4 + 1;
      if ((0x1000 < uVar8) || (local_c0 = uVar8, ip + uVar8 == iHighLimit)) goto LAB_001a1d7f;
    }
    puVar9 = local_40 + (uVar19 & uVar14) * 2;
    if (pBVar16[uVar8] < ip[uVar8]) {
      *local_d0 = uVar19;
      if (uVar19 <= uVar10) {
        local_d0 = &local_6c;
LAB_001a1d7f:
        *local_d8 = 0;
        *local_d0 = 0;
        if (0x40000000 < local_b4) {
          __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8221,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        if (uVar18 + 8 < local_dc) {
          ms->nextToUpdate = local_dc - 8;
          return UVar4;
        }
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8248,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      puVar9 = puVar9 + 1;
      uVar12 = uVar8;
      local_d0 = puVar9;
    }
    else {
      *local_d8 = uVar19;
      local_d8 = puVar9;
      uVar17 = uVar8;
      if (uVar19 <= uVar10) {
        local_d8 = &local_6c;
        goto LAB_001a1d7f;
      }
    }
    uVar20 = (ulong)*puVar9;
    local_b4 = local_b4 - 1;
  } while( true );
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}